

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_features.c
# Opt level: O1

LY_ERR lys_set_features(lysp_module *pmod,char **features)

{
  char *pcVar1;
  bool bVar2;
  ulong uVar3;
  ushort uVar4;
  int iVar5;
  size_t sVar6;
  lysp_feature *plVar7;
  ulong uVar8;
  bool bVar9;
  uint32_t i;
  uint32_t local_3c;
  lysp_module *local_38;
  
  local_3c = 0;
  if (features == (char **)0x0) {
    bVar2 = false;
  }
  else if (*features == (char *)0x0) {
    bVar2 = false;
    plVar7 = lysp_feature_next((lysp_feature *)0x0,pmod,&local_3c);
    if (plVar7 != (lysp_feature *)0x0) {
      bVar2 = false;
      do {
        if ((plVar7->flags & 0x20) != 0) {
          plVar7->flags = plVar7->flags & 0xffdf;
          bVar2 = true;
        }
        plVar7 = lysp_feature_next(plVar7,pmod,&local_3c);
      } while (plVar7 != (lysp_feature *)0x0);
    }
  }
  else {
    iVar5 = strcmp(*features,"*");
    if (iVar5 == 0) {
      bVar2 = false;
      plVar7 = lysp_feature_next((lysp_feature *)0x0,pmod,&local_3c);
      if (plVar7 != (lysp_feature *)0x0) {
        bVar2 = false;
        do {
          if ((plVar7->flags & 0x20) == 0) {
            plVar7->flags = plVar7->flags | 0x20;
            bVar2 = true;
          }
          plVar7 = lysp_feature_next(plVar7,pmod,&local_3c);
        } while (plVar7 != (lysp_feature *)0x0);
      }
    }
    else {
      pcVar1 = *features;
      if (pcVar1 != (char *)0x0) {
        sVar6 = strlen(pcVar1);
        uVar8 = 0;
        plVar7 = lysp_feature_find(pmod,pcVar1,sVar6,'\0');
        if (plVar7 != (lysp_feature *)0x0) {
          uVar3 = 1;
          do {
            uVar8 = uVar3;
            pcVar1 = features[uVar8];
            if (pcVar1 == (char *)0x0) goto LAB_001567ca;
            sVar6 = strlen(pcVar1);
            plVar7 = lysp_feature_find(pmod,pcVar1,sVar6,'\0');
            uVar3 = (ulong)((int)uVar8 + 1);
          } while (plVar7 != (lysp_feature *)0x0);
        }
        ly_log(pmod->mod->ctx,LY_LLERR,LY_EINVAL,"Feature \"%s\" not found in module \"%s\".",
               features[uVar8],pmod->mod->name);
        return LY_EINVAL;
      }
LAB_001567ca:
      bVar2 = false;
      plVar7 = lysp_feature_next((lysp_feature *)0x0,pmod,&local_3c);
      if (plVar7 != (lysp_feature *)0x0) {
        bVar2 = false;
        local_38 = pmod;
        do {
          bVar9 = *features == (char *)0x0;
          if (bVar9) {
LAB_00156835:
            if ((plVar7->flags & 0x20) != 0) {
              uVar4 = plVar7->flags & 0xffdf;
LAB_00156854:
              plVar7->flags = uVar4;
              bVar2 = true;
            }
          }
          else {
            pcVar1 = plVar7->name;
            iVar5 = strcmp(pcVar1,*features);
            if (iVar5 != 0) {
              uVar8 = 1;
              do {
                bVar9 = features[uVar8] == (char *)0x0;
                if (bVar9) goto LAB_00156835;
                iVar5 = strcmp(pcVar1,features[uVar8]);
                uVar8 = (ulong)((int)uVar8 + 1);
              } while (iVar5 != 0);
            }
            if (bVar9) goto LAB_00156835;
            if ((plVar7->flags & 0x20) == 0) {
              uVar4 = plVar7->flags | 0x20;
              goto LAB_00156854;
            }
            if (bVar9) goto LAB_00156835;
          }
          plVar7 = lysp_feature_next(plVar7,local_38,&local_3c);
        } while (plVar7 != (lysp_feature *)0x0);
      }
    }
  }
  return (uint)!bVar2 << 2;
}

Assistant:

LY_ERR
lys_set_features(struct lysp_module *pmod, const char **features)
{
    uint32_t i = 0, j;
    struct lysp_feature *f = 0;
    ly_bool change = 0;

    if (!features) {
        /* do not touch the features */

    } else if (!features[0]) {
        /* disable all the features */
        while ((f = lysp_feature_next(f, pmod, &i))) {
            if (f->flags & LYS_FENABLED) {
                f->flags &= ~LYS_FENABLED;
                change = 1;
            }
        }
    } else if (!strcmp(features[0], "*")) {
        /* enable all the features */
        while ((f = lysp_feature_next(f, pmod, &i))) {
            if (!(f->flags & LYS_FENABLED)) {
                f->flags |= LYS_FENABLED;
                change = 1;
            }
        }
    } else {
        /* check that all the features exist */
        for (j = 0; features[j]; ++j) {
            if (!lysp_feature_find(pmod, features[j], strlen(features[j]), 0)) {
                LOGERR(pmod->mod->ctx, LY_EINVAL, "Feature \"%s\" not found in module \"%s\".", features[j], pmod->mod->name);
                return LY_EINVAL;
            }
        }

        /* enable specific features, disable the rest */
        while ((f = lysp_feature_next(f, pmod, &i))) {
            for (j = 0; features[j]; ++j) {
                if (!strcmp(f->name, features[j])) {
                    break;
                }
            }

            if (features[j] && !(f->flags & LYS_FENABLED)) {
                /* enable */
                f->flags |= LYS_FENABLED;
                change = 1;
            } else if (!features[j] && (f->flags & LYS_FENABLED)) {
                /* disable */
                f->flags &= ~LYS_FENABLED;
                change = 1;
            }
        }
    }

    if (!change) {
        /* features already set correctly */
        return LY_EEXIST;
    }

    return LY_SUCCESS;
}